

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

ngx_err_t ngx_create_full_path(u_char *dir,ngx_uint_t access)

{
  u_char *puVar1;
  int iVar2;
  int *piVar3;
  u_char *puVar4;
  int iVar5;
  
  iVar5 = 0;
  puVar4 = dir;
  do {
    do {
      puVar1 = puVar4 + 1;
      if (*puVar1 == '\0') {
        return iVar5;
      }
      puVar4 = puVar4 + 1;
    } while (*puVar1 != '/');
    *puVar4 = '\0';
    iVar2 = mkdir((char *)dir,(__mode_t)access);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      iVar5 = *piVar3;
      if (iVar5 != 0xd) {
        if (iVar5 != 0x11) {
          return iVar5;
        }
        iVar5 = 0;
      }
    }
    *puVar4 = '/';
  } while( true );
}

Assistant:

ngx_err_t
ngx_create_full_path(u_char *dir, ngx_uint_t access)
{
    u_char     *p, ch;
    ngx_err_t   err;

    err = 0;

#if (NGX_WIN32)
    p = dir + 3;
#else
    p = dir + 1;
#endif

    for ( /* void */ ; *p; p++) {
        ch = *p;

        if (ch != '/') {
            continue;
        }

        *p = '\0';

        if (ngx_create_dir(dir, access) == NGX_FILE_ERROR) {
            err = ngx_errno;

            switch (err) {
            case NGX_EEXIST:
                err = 0;
            case NGX_EACCES:
                break;

            default:
                return err;
            }
        }

        *p = '/';
    }

    return err;
}